

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

iteration_time __thiscall helics::Federate::requestTimeIterativeComplete(Federate *this)

{
  string_view message;
  bool bVar1;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  Time in_RDI;
  iteration_time iVar3;
  handle asyncInfo;
  Modes exp;
  iteration_time iterativeTime;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff58;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> *this_00;
  Modes newMode;
  memory_order in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar4;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 iterating;
  Time in_stack_ffffffffffffff78;
  Time in_stack_ffffffffffffff80;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_38;
  undefined1 local_19;
  Time local_10;
  undefined1 local_8;
  
  local_19 = 8;
  bVar1 = std::atomic<helics::Federate::Modes>::compare_exchange_strong
                    ((atomic<helics::Federate::Modes> *)in_RDI.internalTimeCode,
                     (Modes *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                     (Modes)((uint)in_stack_ffffffffffffff64 >> 0x18),in_stack_ffffffffffffff60);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    message._M_len._7_1_ = in_stack_ffffffffffffff6f;
    message._M_len._0_7_ = in_stack_ffffffffffffff68;
    message._M_str = (char *)in_RDI.internalTimeCode;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               message);
    __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                *)0x2084d6);
  this_00 = &local_38;
  gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
            (in_stack_ffffffffffffff48);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(this_00);
  newMode = (Modes)((ulong)this_00 >> 0x38);
  iVar3 = std::future<helics::iteration_time>::get
                    ((future<helics::iteration_time> *)
                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  local_10 = iVar3.grantedTime.internalTimeCode;
  local_8 = iVar3.state;
  uVar4 = CONCAT13(local_8,(int3)in_stack_ffffffffffffff64);
  iterating = iVar3.grantedTime.internalTimeCode._7_1_;
  switch(local_8) {
  case 0:
    postTimeRequestOperations((Federate *)local_10.internalTimeCode,in_RDI,(bool)local_8);
    break;
  case 2:
    postTimeRequestOperations((Federate *)local_10.internalTimeCode,in_RDI,(bool)local_8);
    break;
  case 3:
    updateFederateMode((Federate *)CONCAT44(uVar4,in_stack_ffffffffffffff60),newMode);
    updateSimulationTime
              ((Federate *)in_RDI.internalTimeCode,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,(bool)iterating);
    break;
  case 7:
    updateFederateMode((Federate *)CONCAT44(uVar4,in_stack_ffffffffffffff60),newMode);
  }
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
            ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x20862a);
  iVar3._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar3.state = local_8;
  iVar3.grantedTime.internalTimeCode = local_10.internalTimeCode;
  return iVar3;
}

Assistant:

iteration_time Federate::requestTimeIterativeComplete()
{
    auto exp = Modes::PENDING_ITERATIVE_TIME;
    if (currentMode.compare_exchange_strong(exp, Modes::EXECUTING)) {
        auto asyncInfo = asyncCallInfo->lock();
        auto iterativeTime = asyncInfo->timeRequestIterativeFuture.get();
        switch (iterativeTime.state) {
            case IterationResult::NEXT_STEP:
                postTimeRequestOperations(iterativeTime.grantedTime, false);
                break;
            case IterationResult::ITERATING:
                postTimeRequestOperations(iterativeTime.grantedTime, true);
                break;
            case IterationResult::HALTED:
                updateFederateMode(Modes::FINISHED);
                updateSimulationTime(iterativeTime.grantedTime, mCurrentTime, false);
                break;
            case IterationResult::ERROR_RESULT:
                // LCOV_EXCL_START
                updateFederateMode(Modes::ERROR_STATE);
                break;
                // LCOV_EXCL_STOP
        }
        return iterativeTime;
    }
    throw(InvalidFunctionCall(
        "cannot call requestTimeIterativeComplete without first calling requestTimeIterativeAsync function"));
}